

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O3

void nsync_cv_signal(nsync_cv *pcv)

{
  int *piVar1;
  void *pvVar2;
  uint32_t uVar3;
  int iVar4;
  nsync_dll_element_ *pnVar5;
  nsync_dll_list_ pnVar6;
  nsync_dll_element_ *pnVar7;
  uint32_t uVar8;
  bool bVar9;
  bool bVar10;
  int local_48;
  nsync_dll_list_ local_40;
  
  if ((pcv->word & 2) != 0) {
    local_48 = 0;
    uVar3 = nsync_spin_test_and_set_(&pcv->word,1,1,0);
    iVar4 = nsync_dll_is_empty_(pcv->waiters);
    if (iVar4 == 0) {
      pnVar5 = nsync_dll_first_(pcv->waiters);
      pnVar6 = nsync_dll_remove_(pcv->waiters,pnVar5);
      pcv->waiters = pnVar6;
      pvVar2 = pnVar5->container;
      if ((*(byte *)((long)pvVar2 + 0x30) & 1) != 0) {
        do {
          iVar4 = *(int *)((long)pnVar5->container + 0x48);
          piVar1 = (int *)((long)pnVar5->container + 0x48);
          LOCK();
          bVar9 = iVar4 == *piVar1;
          if (bVar9) {
            *piVar1 = iVar4 + 1;
          }
          UNLOCK();
        } while (!bVar9);
      }
      local_40 = nsync_dll_make_last_in_list_((nsync_dll_list_)0x0,pnVar5);
      if (((*(byte *)((long)pvVar2 + 0x30) & 1) == 0) ||
         (*(lock_type **)((long)pnVar5->container + 0x40) != nsync_reader_type_)) {
        local_48 = 0;
      }
      else {
        pnVar5 = nsync_dll_first_(pcv->waiters);
        if (pnVar5 == (nsync_dll_element_ *)0x0) {
          local_48 = 1;
        }
        else {
          bVar9 = false;
          local_48 = 1;
          do {
            pvVar2 = pnVar5->container;
            pnVar7 = nsync_dll_next_(pcv->waiters,pnVar5);
            if (((*(byte *)((long)pvVar2 + 0x30) & 1) == 0) ||
               (*(lock_type **)((long)pnVar5->container + 0x40) != nsync_reader_type_)) {
              bVar10 = !bVar9;
              bVar9 = true;
              if (bVar10) {
                local_48 = 0;
                bVar9 = true;
                goto LAB_00104f50;
              }
            }
            else {
LAB_00104f50:
              pnVar6 = nsync_dll_remove_(pcv->waiters,pnVar5);
              pcv->waiters = pnVar6;
              if ((*(byte *)((long)pvVar2 + 0x30) & 1) != 0) {
                do {
                  iVar4 = *(int *)((long)pnVar5->container + 0x48);
                  piVar1 = (int *)((long)pnVar5->container + 0x48);
                  LOCK();
                  bVar10 = iVar4 == *piVar1;
                  if (bVar10) {
                    *piVar1 = iVar4 + 1;
                  }
                  UNLOCK();
                } while (!bVar10);
              }
              local_40 = nsync_dll_make_last_in_list_(local_40,pnVar5);
            }
            pnVar5 = pnVar7;
          } while (pnVar7 != (nsync_dll_element_ *)0x0);
        }
      }
      iVar4 = nsync_dll_is_empty_(pcv->waiters);
      uVar8 = uVar3 & 0xfffffffd;
      if (iVar4 == 0) {
        uVar8 = uVar3;
      }
    }
    else {
      local_40 = (nsync_dll_list_)0x0;
      uVar8 = uVar3;
    }
    pcv->word = uVar8;
    iVar4 = nsync_dll_is_empty_(local_40);
    if (iVar4 == 0) {
      wake_waiters(local_40,local_48);
      return;
    }
  }
  return;
}

Assistant:

void nsync_cv_signal (nsync_cv *pcv) {
	IGNORE_RACES_START ();
	if ((ATM_LOAD_ACQ (&pcv->word) & CV_NON_EMPTY) != 0) { /* acquire load */
		nsync_dll_list_ to_wake_list = NULL; /* waiters that we will wake */
		int all_readers = 0;
		/* acquire spinlock */
		uint32_t old_word = nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK,
							      CV_SPINLOCK, 0);
		if (!nsync_dll_is_empty_ (pcv->waiters)) {
			/* Point to first waiter that enqueued itself, and
			   detach it from all others.  */
			struct nsync_waiter_s *first_nw;
			nsync_dll_element_ *first = nsync_dll_first_ (pcv->waiters);
			pcv->waiters = nsync_dll_remove_ (pcv->waiters, first);
			first_nw = DLL_NSYNC_WAITER (first);
			if ((first_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
				uint32_t old_value;
				do {    
					old_value =
						ATM_LOAD (&DLL_WAITER (first)->remove_count);
				} while (!ATM_CAS (&DLL_WAITER (first)->remove_count,
						   old_value, old_value+1));
			}
			to_wake_list = nsync_dll_make_last_in_list_ (to_wake_list, first);
			if ((first_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0 &&
			    DLL_WAITER (first)->l_type == nsync_reader_type_) {
				int woke_writer;
				/* If the first waiter is a reader, wake all readers, and
				   if it's possible, one writer.  This allows reader-regions
				   to be added to a monitor without invalidating code in which
				   a client has optimized broadcast calls by converting them to 
				   signal calls.  In particular, we wake a writer when waking
				   readers because the readers will not invalidate the condition
				   that motivated the client to call nsync_cv_signal().  But we
				   wake at most one writer because the first writer may invalidate
				   the condition; the client is expecting only one writer to be
				   able make use of the wakeup, or he would have called
				   nsync_cv_broadcast().  */
				nsync_dll_element_ *p = NULL;
				nsync_dll_element_ *next = NULL;
				all_readers = 1;
				woke_writer = 0;
				for (p = nsync_dll_first_ (pcv->waiters); p != NULL; p = next) {
					struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
					int should_wake;
					next = nsync_dll_next_ (pcv->waiters, p);
					should_wake = 0;
					if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0 &&
					     DLL_WAITER (p)->l_type == nsync_reader_type_) {
						should_wake = 1;
					} else if (!woke_writer) {
						woke_writer = 1;
						all_readers = 0;
						should_wake = 1;
					}
					if (should_wake) {
						pcv->waiters = nsync_dll_remove_ (pcv->waiters, p);
						if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
							uint32_t old_value;
							do {    
								old_value = ATM_LOAD (
								    &DLL_WAITER (p)->remove_count);
							} while (!ATM_CAS (&DLL_WAITER (p)->remove_count,
									   old_value, old_value+1));
						}
						to_wake_list = nsync_dll_make_last_in_list_ (
							to_wake_list, p);
					}
				}
			}
			if (nsync_dll_is_empty_ (pcv->waiters)) {
				old_word &= ~(CV_NON_EMPTY);
			}
		}
		/* Release spinlock. */
		ATM_STORE_REL (&pcv->word, old_word); /* release store */
		if (!nsync_dll_is_empty_ (to_wake_list)) {
			wake_waiters (to_wake_list, all_readers);
		}
	}
	IGNORE_RACES_END ();
}